

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsPseudocost.h
# Opt level: O1

double __thiscall
HighsPseudocost::getScore(HighsPseudocost *this,HighsInt col,double upcost,double downcost)

{
  double dVar1;
  pointer pdVar2;
  long lVar3;
  long lVar4;
  undefined1 auVar5 [16];
  double dVar6;
  double dVar7;
  double dVar8;
  double dVar9;
  double dVar10;
  double dVar11;
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  double dVar15;
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  double dVar18;
  double dVar19;
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  
  dVar10 = this->cost_total * this->cost_total;
  if (dVar10 <= 1e-06) {
    dVar10 = 1e-06;
  }
  pdVar2 = (this->conflictscoreup).super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_start;
  dVar1 = this->conflict_weight;
  lVar3 = (long)(this->conflictscoreup).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                super__Vector_impl_data._M_finish - (long)pdVar2;
  lVar4 = lVar3 >> 3;
  auVar5._8_4_ = (int)(lVar3 >> 0x23);
  auVar5._0_8_ = lVar4;
  auVar5._12_4_ = 0x45300000;
  dVar7 = this->conflict_avg_score /
          (((auVar5._8_8_ - 1.9342813113834067e+25) +
           ((double)CONCAT44(0x43300000,(int)lVar4) - 4503599627370496.0)) * dVar1);
  dVar7 = dVar7 * dVar7;
  if (dVar7 <= 1e-06) {
    dVar7 = 1e-06;
  }
  dVar8 = 1e-06;
  if (1e-06 <= upcost) {
    dVar8 = upcost;
  }
  dVar6 = 1e-06;
  if (1e-06 <= downcost) {
    dVar6 = downcost;
  }
  dVar9 = (double)(this->ncutoffsup).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                  super__Vector_impl_data._M_start[col];
  dVar15 = (double)(this->nsamplesup).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                   super__Vector_impl_data._M_start[col] + dVar9;
  if (dVar15 <= 1.0) {
    dVar15 = 1.0;
  }
  dVar11 = (double)(this->ncutoffsdown).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                   super__Vector_impl_data._M_start[col];
  dVar18 = (double)(this->nsamplesdown).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                   super__Vector_impl_data._M_start[col] + dVar11;
  if (dVar18 <= 1.0) {
    dVar18 = 1.0;
  }
  dVar19 = (double)this->nsamplestotal + (double)this->ncutoffstotal;
  if (dVar19 <= 1.0) {
    dVar19 = 1.0;
  }
  dVar19 = (double)this->ncutoffstotal / dVar19;
  auVar21._8_8_ =
       (this->conflictscoredown).super__Vector_base<double,_std::allocator<double>_>._M_impl.
       super__Vector_impl_data._M_start[col];
  auVar21._0_8_ = pdVar2[col];
  auVar20._8_8_ = dVar1;
  auVar20._0_8_ = dVar1;
  auVar16 = divpd(auVar21,auVar20);
  auVar12._0_8_ = this->inferences_total * this->inferences_total;
  auVar12._8_8_ = dVar19 * dVar19;
  auVar5 = maxpd(auVar12,_DAT_003d7270);
  auVar21 = maxpd(_DAT_003d7270,auVar16);
  auVar17._8_8_ = dVar9 / dVar15;
  auVar17._0_8_ =
       (this->inferencesup).super__Vector_base<double,_std::allocator<double>_>._M_impl.
       super__Vector_impl_data._M_start[col];
  auVar20 = maxpd(_DAT_003d7270,auVar17);
  auVar16._8_8_ = dVar11 / dVar18;
  auVar16._0_8_ =
       (this->inferencesdown).super__Vector_base<double,_std::allocator<double>_>._M_impl.
       super__Vector_impl_data._M_start[col];
  auVar12 = maxpd(_DAT_003d7270,auVar16);
  auVar13._0_8_ = auVar12._0_8_ * auVar20._0_8_;
  auVar13._8_8_ = auVar12._8_8_ * auVar20._8_8_;
  auVar5 = divpd(auVar13,auVar5);
  auVar14._0_8_ = auVar5._0_8_ + (double)DAT_003c93e0;
  auVar14._8_8_ = auVar5._8_8_ + DAT_003c93e0._8_8_;
  auVar5 = divpd(_DAT_003c93e0,auVar14);
  return ((1.0 - 1.0 / ((auVar21._8_8_ * auVar21._0_8_) / dVar7 + 1.0)) * 0.01 +
         ((DAT_003c93e0._8_8_ - auVar5._8_8_) + ((double)DAT_003c93e0 - auVar5._0_8_)) * 0.0001) *
         this->degeneracyFactor +
         (1.0 - 1.0 / ((dVar6 * dVar8) / dVar10 + 1.0)) / this->degeneracyFactor;
}

Assistant:

double getScore(HighsInt col, double upcost, double downcost) const {
    double costScore = std::max(upcost, 1e-6) * std::max(downcost, 1e-6) /
                       std::max(1e-6, cost_total * cost_total);
    double inferenceScore = std::max(inferencesup[col], 1e-6) *
                            std::max(inferencesdown[col], 1e-6) /
                            std::max(1e-6, inferences_total * inferences_total);

    double cutOffScoreUp =
        ncutoffsup[col] /
        std::max(1.0, static_cast<double>(ncutoffsup[col]) +
                          static_cast<double>(nsamplesup[col]));
    double cutOffScoreDown =
        ncutoffsdown[col] /
        std::max(1.0, static_cast<double>(ncutoffsdown[col]) +
                          static_cast<double>(nsamplesdown[col]));
    double avgCutoffs = static_cast<double>(ncutoffstotal) /
                        std::max(1.0, static_cast<double>(ncutoffstotal) +
                                          static_cast<double>(nsamplestotal));

    double cutoffScore = std::max(cutOffScoreUp, 1e-6) *
                         std::max(cutOffScoreDown, 1e-6) /
                         std::max(1e-6, avgCutoffs * avgCutoffs);

    double conflictScoreUp = conflictscoreup[col] / conflict_weight;
    double conflictScoreDown = conflictscoredown[col] / conflict_weight;
    double conflictScoreAvg =
        conflict_avg_score /
        (conflict_weight * static_cast<double>(conflictscoreup.size()));
    double conflictScore = std::max(conflictScoreUp, 1e-6) *
                           std::max(conflictScoreDown, 1e-6) /
                           std::max(1e-6, conflictScoreAvg * conflictScoreAvg);

    auto mapScore = [](double score) { return 1.0 - 1.0 / (1.0 + score); };
    return mapScore(costScore) / degeneracyFactor +
           degeneracyFactor *
               (1e-2 * mapScore(conflictScore) +
                1e-4 * (mapScore(cutoffScore) + mapScore(inferenceScore)));
  }